

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t *
Gia_ManDupFromVecs(Gia_Man_t *p,Vec_Int_t *vCis,Vec_Int_t *vAnds,Vec_Int_t *vCos,int nRegs)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_44;
  Gia_Obj_t *pGStack_40;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int nRegs_local;
  Vec_Int_t *vCos_local;
  Vec_Int_t *vAnds_local;
  Vec_Int_t *vCis_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManStart(5000);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCis);
    bVar5 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vCis,local_44);
      pGStack_40 = Gia_ManObj(p,iVar1);
      bVar5 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGStack_40->Value = uVar2;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vAnds);
    bVar5 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vAnds,local_44);
      pGStack_40 = Gia_ManObj(p,iVar1);
      bVar5 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_40);
    iLit1 = Gia_ObjFanin1Copy(pGStack_40);
    uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
    pGStack_40->Value = uVar2;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vCos);
    bVar5 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vCos,local_44);
      pGStack_40 = Gia_ManObj(p,iVar1);
      bVar5 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_40);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_40->Value = uVar2;
    local_44 = local_44 + 1;
  }
  Gia_ManSetRegNum(p_00,nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFromVecs( Gia_Man_t * p, Vec_Int_t * vCis, Vec_Int_t * vAnds, Vec_Int_t * vCos, int nRegs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create constant
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    Gia_ManForEachObjVec( vCis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create ROs
    Gia_ManForEachObjVec( vCos, p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, nRegs );
    return pNew;
}